

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_loading_thread.c
# Opt level: O0

void * loading_thread(ALLEGRO_THREAD *thread,void *arg)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ALLEGRO_BITMAP *pAVar6;
  void *in_RSI;
  undefined8 in_RDI;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ALLEGRO_BITMAP *bmp;
  ALLEGRO_COLOR color;
  ALLEGRO_COLOR text;
  ALLEGRO_FONT *font;
  undefined8 local_48;
  undefined8 local_40;
  
  uVar4 = al_load_font("data/fixed_font.tga",0);
  uVar9 = 0x437f0000;
  uVar7 = al_map_rgb_f(0x437f0000);
  load_count = 0;
  uVar10 = uVar9;
  while (load_count < 100) {
    uVar1 = rand();
    iVar2 = rand();
    uVar3 = rand();
    uVar8 = al_map_rgb(uVar1 & 0xff,(char)iVar2,uVar3 & 0xff,iVar2);
    local_48._0_4_ = (float)uVar8;
    local_48._4_4_ = (float)((ulong)uVar8 >> 0x20);
    local_48 = CONCAT44(local_48._4_4_ / 4.0,(float)local_48 / 4.0);
    local_40._0_4_ = (float)uVar10;
    local_40._4_4_ = (float)((ulong)uVar10 >> 0x20);
    local_40 = CONCAT44(local_40._4_4_ / 4.0,(float)local_40 / 4.0);
    uVar5 = al_get_thread_should_stop(in_RDI);
    if ((uVar5 & 1) != 0) break;
    pAVar6 = (ALLEGRO_BITMAP *)al_load_bitmap("data/mysha.pcx");
    al_set_target_bitmap(pAVar6);
    al_draw_filled_rectangle(0,0,0x43a00000,0x43480000,local_48,local_40);
    uVar10 = uVar9;
    al_draw_textf(uVar7,uVar9,0,uVar4,0,"bitmap %d",load_count + 1);
    al_set_target_bitmap(0);
    al_lock_mutex(mutex);
    bitmaps[load_count] = pAVar6;
    load_count = load_count + 1;
    al_unlock_mutex(mutex);
    al_rest(0x3fa999999999999a);
  }
  al_destroy_font(uVar4);
  return in_RSI;
}

Assistant:

static void *loading_thread(ALLEGRO_THREAD *thread, void *arg)
{
   ALLEGRO_FONT *font;
   ALLEGRO_COLOR text;

   font = al_load_font("data/fixed_font.tga", 0, 0);
   text = al_map_rgb_f(255, 255, 255);

   /* In this example we load mysha.pcx 100 times to simulate loading
    * many bitmaps.
    */
   load_count = 0;
   while (load_count < load_total) {
      ALLEGRO_COLOR color;
      ALLEGRO_BITMAP *bmp;

      color = al_map_rgb(rand() % 256, rand() % 256, rand() % 256);
      color.r /= 4;
      color.g /= 4;
      color.b /= 4;
      color.a /= 4;

      if (al_get_thread_should_stop(thread))
         break;

      bmp = al_load_bitmap("data/mysha.pcx");

      /* Simulate different contents. */
      al_set_target_bitmap(bmp);
      al_draw_filled_rectangle(0, 0, 320, 200, color);
      al_draw_textf(font, text, 0, 0, 0, "bitmap %d", 1 + load_count);
      al_set_target_bitmap(NULL);

      /* Allow the main thread to see the completed bitmap. */
      al_lock_mutex(mutex);
      bitmaps[load_count] = bmp;
      load_count++;
      al_unlock_mutex(mutex);

      /* Simulate that it's slow. */
      al_rest(0.05);
   }
   
   al_destroy_font(font); 
   return arg;
}